

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O0

REF_STATUS ref_grid_contiguous_cell_global(REF_GRID ref_grid,REF_LONG *global)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_LONG offset;
  REF_LONG global_ncell;
  REF_LONG *cell_global;
  REF_CELL ref_cell;
  int local_30;
  REF_INT cell;
  REF_INT ncell;
  REF_INT group;
  REF_NODE ref_node;
  REF_LONG *global_local;
  REF_GRID ref_grid_local;
  
  _ncell = ref_grid->node;
  local_30 = 0;
  _ref_private_macro_code_rss_1 = 0;
  cell = 0;
  cell_global = (REF_LONG *)ref_grid->cell[0];
  ref_node = (REF_NODE)global;
  global_local = (REF_LONG *)ref_grid;
  while( true ) {
    if (0xf < cell) {
      return 0;
    }
    uVar1 = ref_cell_global((REF_CELL)cell_global,_ncell,(REF_LONG **)&global_ncell);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x4ff,
             "ref_grid_contiguous_cell_global",(ulong)uVar1,"cell global");
      return uVar1;
    }
    for (ref_cell._4_4_ = 0; ref_cell._4_4_ < *(int *)((long)cell_global + 0x2c);
        ref_cell._4_4_ = ref_cell._4_4_ + 1) {
      if (((-1 < ref_cell._4_4_) && (ref_cell._4_4_ < *(int *)((long)cell_global + 0x2c))) &&
         (*(int *)(cell_global[7] + (long)((int)cell_global[1] * ref_cell._4_4_) * 4) != -1)) {
        if ((int)cell_global[5] <= ref_cell._4_4_) {
          if (global_ncell != 0) {
            free((void *)global_ncell);
          }
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                 0x503,"ref_grid_contiguous_cell_global",1,"pack grid before calling");
          return 1;
        }
        *(long *)(&ref_node->n + (long)local_30 * 2) =
             *(long *)(global_ncell + (long)ref_cell._4_4_ * 8) + _ref_private_macro_code_rss_1;
        local_30 = local_30 + 1;
      }
    }
    if (global_ncell != 0) {
      free((void *)global_ncell);
    }
    uVar1 = ref_cell_ncell((REF_CELL)cell_global,_ncell,&offset);
    if (uVar1 != 0) break;
    _ref_private_macro_code_rss_1 = offset + _ref_private_macro_code_rss_1;
    cell = cell + 1;
    cell_global = (REF_LONG *)global_local[(long)cell + 2];
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x509,
         "ref_grid_contiguous_cell_global",(ulong)uVar1,"global ncell");
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_grid_contiguous_cell_global(REF_GRID ref_grid,
                                                   REF_LONG *global) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT group, ncell, cell;
  REF_CELL ref_cell;
  REF_LONG *cell_global, global_ncell, offset;
  ncell = 0;
  offset = 0;
  each_ref_grid_all_ref_cell(ref_grid, group, ref_cell) {
    RSS(ref_cell_global(ref_cell, ref_node, &cell_global), "cell global");
    each_ref_cell_valid_cell(ref_cell, cell) {
      if (cell >= ref_cell_n(ref_cell)) {
        ref_free(cell_global);
        RSS(REF_FAILURE, "pack grid before calling");
      }
      global[ncell] = cell_global[cell] + offset;
      ncell++;
    }
    ref_free(cell_global);
    RSS(ref_cell_ncell(ref_cell, ref_node, &global_ncell), "global ncell");
    offset += global_ncell;
  }
  return REF_SUCCESS;
}